

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O1

TPZGeoEl * __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>_>::CreateBCGeoEl
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>_> *this,int side,int bc)

{
  TPZGeoMesh *pTVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  bool bVar4;
  MElementType MVar5;
  uint uVar6;
  int iVar7;
  ostream *poVar8;
  TPZGeoEl *gel;
  undefined4 extraout_var;
  ulong uVar9;
  uint uVar10;
  int64_t size;
  int orientednode;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  TPZManVector<long,_4> nodeindices;
  int64_t index;
  TPZStack<int,_10> LowAllSides;
  TPZManVector<int,_27> mapside;
  TPZGeoElSide BCGelside;
  TPZGeoElSide thisside;
  TPZManVector<long,_4> local_180;
  undefined1 local_140 [8];
  TPZManVector<int,_10> local_138;
  TPZManVector<int,_27> local_f0;
  TPZGeoElSide local_60;
  TPZGeoElSide local_48;
  
  if ((uint)side < 3) {
    MVar5 = pztopology::TPZLine::Type(side);
    uVar6 = pztopology::TPZLine::NSideNodes(side);
    switch(MVar5) {
    case EPoint:
      size = 1;
      break;
    case EOned:
      size = 3;
      break;
    case ETriangle:
      size = 7;
      break;
    case EQuadrilateral:
      size = 9;
      break;
    default:
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzgeoelrefless.h.h"
                 ,0x124);
    }
    local_138.super_TPZVec<int>._vptr_TPZVec._0_4_ = 0;
    TPZManVector<int,_27>::TPZManVector(&local_f0,size,(int *)&local_138);
    auVar2 = _DAT_014f8350;
    uVar10 = (int)size + (uint)((int)size == 0);
    lVar11 = (ulong)uVar10 - 1;
    auVar12._8_4_ = (int)lVar11;
    auVar12._0_8_ = lVar11;
    auVar12._12_4_ = (int)((ulong)lVar11 >> 0x20);
    uVar9 = 0;
    auVar12 = auVar12 ^ _DAT_014f8350;
    auVar13 = _DAT_014f8340;
    do {
      auVar14 = auVar13 ^ auVar2;
      if ((bool)(~(auVar14._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar14._0_4_ ||
                  auVar12._4_4_ < auVar14._4_4_) & 1)) {
        local_f0.super_TPZVec<int>.fStore[uVar9] = (int)uVar9;
      }
      if ((auVar14._12_4_ != auVar12._12_4_ || auVar14._8_4_ <= auVar12._8_4_) &&
          auVar14._12_4_ <= auVar12._12_4_) {
        local_f0.super_TPZVec<int>.fStore[uVar9 + 1] = (int)uVar9 + 1;
      }
      uVar9 = uVar9 + 2;
      lVar11 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 2;
      auVar13._8_8_ = lVar11 + 2;
    } while ((uVar10 + 1 & 0x1e) != uVar9);
    TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_138);
    pztopology::TPZLine::LowerDimensionSides(side,(TPZStack<int,_10> *)&local_138);
    TPZStack<int,_10>::Push((TPZStack<int,_10> *)&local_138,side);
    bVar3 = pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>::IsLinearMapping(&this->fGeo,side);
    if (0 < local_138.super_TPZVec<int>.fNElements) {
      lVar11 = 0;
      do {
        iVar7 = 9;
        if (1 < local_138.super_TPZVec<int>.fStore[lVar11]) {
          bVar4 = pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>::IsLinearMapping
                            (&this->fGeo,local_138.super_TPZVec<int>.fStore[lVar11]);
          if (!bVar4) {
            bVar3 = false;
          }
          iVar7 = 7;
          if (bVar3 != false) {
            iVar7 = 0;
          }
        }
      } while (((iVar7 == 9) || (iVar7 == 0)) &&
              (lVar11 = lVar11 + 1, lVar11 < local_138.super_TPZVec<int>.fNElements));
    }
    if (bVar3 == false) {
      gel = (TPZGeoEl *)
            (**(code **)(*(long *)&this->super_TPZGeoEl + 0x2e0))(this,side,bc,&local_f0);
    }
    else {
      TPZManVector<long,_4>::TPZManVector(&local_180,(long)(int)uVar6);
      if (0 < (int)uVar6) {
        uVar9 = 0;
        do {
          lVar11 = (**(code **)(*(long *)&this->super_TPZGeoEl + 0x128))
                             (this,side,uVar9 & 0xffffffff);
          local_180.super_TPZVec<long>.fStore[uVar9] = lVar11;
          uVar9 = uVar9 + 1;
        } while (uVar6 != uVar9);
      }
      MVar5 = pztopology::TPZLine::Type(side);
      pTVar1 = (this->super_TPZGeoEl).fMesh;
      iVar7 = (*(pTVar1->super_TPZSavable)._vptr_TPZSavable[0xc])
                        (pTVar1,(ulong)MVar5,&local_180,(ulong)(uint)bc,local_140,1);
      gel = (TPZGeoEl *)CONCAT44(extraout_var,iVar7);
      TPZGeoElSide::TPZGeoElSide(&local_60,gel);
      local_48.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_01920090;
      local_48.fGeoEl = &this->super_TPZGeoEl;
      local_48.fSide = side;
      TPZGeoElSide::InsertConnectivity(&local_60,&local_48,&local_f0.super_TPZVec<int>);
      (**(code **)(*(long *)gel + 0x78))(gel);
      if (local_180.super_TPZVec<long>.fStore == local_180.fExtAlloc) {
        local_180.super_TPZVec<long>.fStore = (long *)0x0;
      }
      local_180.super_TPZVec<long>.fNAlloc = 0;
      local_180.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
      if (local_180.super_TPZVec<long>.fStore != (long *)0x0) {
        operator_delete__(local_180.super_TPZVec<long>.fStore);
      }
    }
    TPZManVector<int,_10>::~TPZManVector(&local_138);
    if (local_f0.super_TPZVec<int>.fStore == local_f0.fExtAlloc) {
      local_f0.super_TPZVec<int>.fStore = (int *)0x0;
    }
    local_f0.super_TPZVec<int>.fNAlloc = 0;
    local_f0.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
    if (local_f0.super_TPZVec<int>.fStore != (int *)0x0) {
      operator_delete__(local_f0.super_TPZVec<int>.fStore);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n (",3);
    poVar8 = (ostream *)std::ostream::operator<<(&std::cout,1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,")::CreateBCGeoEl unexpected side = ",0x23);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,side);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    gel = (TPZGeoEl *)0x0;
  }
  return gel;
}

Assistant:

TPZGeoEl *
TPZGeoElRefLess<TGeo>::CreateBCGeoEl(int side, int bc){
	// Consistency check
	int nsides = TGeo::NSides;
	if(side<0 || side >= nsides){
		std::cout << "\n ("<<TGeo::Type()<<")::CreateBCGeoEl unexpected side = " << side << "\n";
		return 0;
	}
	if(fGeo.Dimension == 3 && side == nsides-1){
		std::cout <<"\nCreateBCGeoEl not implemented for tridimensional sides \n";
		return 0;
	}
    
    // the side orientation will be +1 if the side is oriented counterclockwise
    // -1 if the side is clockwise
    
    
    int faceSide = 0;
    if (fGeo.Dimension == 2){
        faceSide = side - TGeo::NCornerNodes;
    } else if (fGeo.Dimension == 3){
        faceSide = side - TGeo::NCornerNodes - TGeo::NumSides(1);
    }

    int sideorient = 1;
    switch (TGeo::Type())
    {
    case ETriangle:
        sideorient = pztopology::TPZTriangle::GetSideOrient(faceSide);
        break;
    case EQuadrilateral:
        sideorient = pztopology::TPZQuadrilateral::GetSideOrient(faceSide);
        break;
    case ETetraedro:
        sideorient = pztopology::TPZTetrahedron::GetSideOrient(faceSide);
        break;
    case ECube:
        sideorient = pztopology::TPZCube::GetSideOrient(faceSide);
        break;
    case EPrisma:
        sideorient = pztopology::TPZPrism::GetSideOrient(faceSide);
        break;
    
    default:
        break;
    }
    
    
    // Build vector with node indices of element to be created
    MElementType sidetype = TGeo::Type(side);
    int sidennodes = TGeo::NSideNodes(side);
    int sizeMap = 0;
    switch (sidetype){
    case EPoint:
        sizeMap = 1;
        break;
    case EOned:
        sizeMap = 3;
        break;
    case ETriangle:
        sizeMap = 7;
        break;
    case EQuadrilateral:
        sizeMap = 9;
        break;
    default:
        DebugStop();
    }

    TPZManVector<int,27> mapside(sizeMap,0);
    for(int i=0; i<sizeMap; i++) mapside[i] = i;
    
    if(sideorient == -1)
    {
        switch(sidetype){
            case EOned:
                mapside = {1,0,2};
                break;
            case ETriangle:
                mapside = {0,2,1,5,4,3,6};
                break;
            case EQuadrilateral:
                mapside = {0,3,2,1,7,6,5,4,8};
            default:
                break;
        }
    }

	// Is side straight?
	TPZStack<int> LowAllSides;
	TGeo::LowerDimensionSides(side,LowAllSides);
    LowAllSides.Push(side);
	bool straight = true;
    if(fGeo.IsLinearMapping(side) == false) straight = false;
	for(int lowside = 0; lowside < LowAllSides.NElements(); lowside++)
	{
		int lside = LowAllSides[lowside]; 
		if(lside < TGeo::NNodes) continue;
		if(fGeo.IsLinearMapping(lside) == false) straight = false;
		if(straight == false) break;
	}
	if(straight == false)
	{
		TPZGeoEl *BCGeoEl = CreateBCGeoBlendEl(side,bc,mapside);
		return BCGeoEl;
	}
	
	// else

	TPZManVector<int64_t,4> nodeindices(sidennodes);
	for(int inode = 0; inode < sidennodes; inode++){
        int orientednode = inode;
        if(sideorient == -1) orientednode = mapside[inode];
		nodeindices[orientednode] = this->SideNodeIndex(side,inode);
	}

	// Create GeoElement
	int64_t index;
	MElementType BCtype = TGeo::Type(side);
	TPZGeoEl *BCGeoEl = this->Mesh()->CreateGeoElement(BCtype, nodeindices, bc, index);

    TPZGeoElSide BCGelside(BCGeoEl);
    TPZGeoElSide thisside(this,side);
    BCGelside.InsertConnectivity(thisside,mapside);
    /*
	// Set Connectivity
	int sidensides = TGeo::NContainedSides(side);
	for(int iside=0; iside < sidensides-1; iside++){
		TPZGeoElSide(BCGeoEl,mapside[iside]).SetConnectivity(TPZGeoElSide(this,TGeo::ContainedSideLocId(side,iside)));
	}
	TPZGeoElSide(BCGeoEl, sidensides-1).SetConnectivity(TPZGeoElSide(this,side));
*/
	// Return pointer to new element
	BCGeoEl->Initialize();
	return BCGeoEl;  
}